

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

ArrayObject * Js::JavascriptArray::DeepCopyInstance(ArrayObject *arrayObject)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptArray *instance;
  JavascriptNativeIntArray *instance_00;
  JavascriptNativeFloatArray *instance_01;
  JavascriptArray *pJStack_28;
  TypeId typeId;
  ArrayObject *arrayCopy;
  ArrayObject *arrayObject_local;
  TypeId typeId_1;
  
  if (arrayObject == (ArrayObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)arrayObject);
  if (0x57 < (int)TVar3) {
    BVar4 = RecyclableObject::IsExternal((RecyclableObject *)arrayObject);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  if (TVar3 == TypeIds_Array) {
    instance = UnsafeVarTo<Js::JavascriptArray,Js::ArrayObject>(arrayObject);
    pJStack_28 = DeepCopyInstance<Js::JavascriptArray>(instance);
  }
  else if (TVar3 == TypeIds_NativeIntArray) {
    instance_00 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::ArrayObject>(arrayObject);
    pJStack_28 = (JavascriptArray *)DeepCopyInstance<Js::JavascriptNativeIntArray>(instance_00);
  }
  else {
    if (TVar3 != TypeIds_ArrayLast) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2f63,
                                  "(!\"Unexpected objectArray type while boxing stack instance\")",
                                  "!\"Unexpected objectArray type while boxing stack instance\"");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      Throw::FatalInternalError(-0x7fffbffb);
    }
    instance_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::ArrayObject>(arrayObject);
    pJStack_28 = (JavascriptArray *)DeepCopyInstance<Js::JavascriptNativeFloatArray>(instance_01);
  }
  return &pJStack_28->super_ArrayObject;
}

Assistant:

ArrayObject* JavascriptArray::DeepCopyInstance(ArrayObject* arrayObject)
    {
        ArrayObject* arrayCopy;
        TypeId typeId = JavascriptOperators::GetTypeId(arrayObject);
        switch (typeId)
        {
        case Js::TypeIds_Array:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptArray>(UnsafeVarTo<JavascriptArray>(arrayObject));
            break;
        case Js::TypeIds_NativeIntArray:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptNativeIntArray>(UnsafeVarTo<JavascriptNativeIntArray>(arrayObject));
            break;
        case Js::TypeIds_NativeFloatArray:
            arrayCopy = JavascriptArray::DeepCopyInstance<JavascriptNativeFloatArray>(UnsafeVarTo<JavascriptNativeFloatArray>(arrayObject));
            break;

        default:
            AssertAndFailFast(!"Unexpected objectArray type while boxing stack instance");
            arrayCopy = nullptr;
        };

        return arrayCopy;
    }